

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbest_generator.cpp
# Opt level: O3

bool __thiscall MeCab::NBestGenerator::next(NBestGenerator *this)

{
  uchar uVar1;
  int iVar2;
  pointer ppQVar3;
  mecab_node_t *pmVar4;
  Node *pNVar5;
  QueueElement *pQVar6;
  mecab_path_t *pmVar7;
  QueueElement *n;
  QueueElement *local_48;
  pointer local_40;
  NBestGenerator *local_38;
  
  local_38 = this;
  do {
    ppQVar3 = (local_38->agenda_).c.
              super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (local_38->agenda_).c.
               super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppQVar3 == local_40) break;
    pQVar6 = *ppQVar3;
    std::
    priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
    ::pop(&this->agenda_);
    pNVar5 = pQVar6->node;
    uVar1 = pNVar5->stat;
    if (uVar1 == '\x02') {
      pQVar6 = pQVar6->next;
      if (pQVar6 == (QueueElement *)0x0) break;
      do {
        pmVar4 = pQVar6->node;
        pNVar5->next = pmVar4;
        pmVar4->prev = pNVar5;
        pQVar6 = pQVar6->next;
        pNVar5 = pmVar4;
      } while (pQVar6 != (QueueElement *)0x0);
    }
    else {
      for (pmVar7 = pNVar5->lpath; pmVar7 != (mecab_path_t *)0x0; pmVar7 = pmVar7->lnext) {
        local_48 = FreeList<MeCab::NBestGenerator::QueueElement>::alloc(&this->freelist_);
        pNVar5 = pmVar7->lnode;
        local_48->node = pNVar5;
        iVar2 = pmVar7->cost;
        local_48->gx = pQVar6->gx + (long)iVar2;
        local_48->fx = (long)iVar2 + pNVar5->cost + pQVar6->gx;
        local_48->next = pQVar6;
        std::
        priority_queue<MeCab::NBestGenerator::QueueElement_*,_std::vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>,_MeCab::NBestGenerator::QueueElementComp>
        ::push(&this->agenda_,&local_48);
      }
    }
  } while (uVar1 != '\x02');
  return ppQVar3 != local_40;
}

Assistant:

bool NBestGenerator::next() {
  while (!agenda_.empty()) {
    QueueElement *top = agenda_.top();
    agenda_.pop();
    Node *rnode = top->node;

    if (rnode->stat == MECAB_BOS_NODE) {  // BOS
      for (QueueElement *n = top; n->next; n = n->next) {
        n->node->next = n->next->node;   // change next & prev
        n->next->node->prev = n->node;
        // TODO: rewrite costs;
      }
      return true;
    }

    for (Path *path = rnode->lpath; path; path = path->lnext) {
      QueueElement *n = freelist_.alloc();
      n->node = path->lnode;
      n->gx = path->cost + top->gx;
      n->fx = path->lnode->cost + path->cost + top->gx;
      n->next = top;
      agenda_.push(n);
    }
  }

  return false;
}